

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O3

size_t embree::sse2::createMortonCodeArray<embree::QuadMesh>
                 (QuadMesh *mesh,mvector<BVHBuilderMorton::BuildPrim> *morton,
                 BuildProgressMonitor *progressMonitor)

{
  intrusive_list_node *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  intrusive_list_node *piVar4;
  char cVar5;
  int iVar6;
  runtime_error *prVar7;
  ulong uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  float fVar11;
  undefined8 extraout_XMM1_Qa;
  float fVar13;
  float fVar14;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar12 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  size_t taskCount;
  MortonCodeMapping mapping_1;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_primrefgen_cpp:177:14)>
  body;
  pair<unsigned_long,_embree::BBox<embree::Vec3fa>_> cb_empty;
  task_group_context context;
  auto_partitioner local_599;
  unsigned_long local_598;
  unsigned_long local_590;
  anon_class_8_1_898bcfc2_conflict11 local_588;
  anon_class_24_3_aac2c921 local_580;
  intrusive_list_node *local_568;
  anon_class_40_5_11684cf9_conflict2 local_560;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_538;
  mvector<BVHBuilderMorton::BuildPrim> *pmStack_530;
  undefined8 local_528;
  uint uStack_520;
  uint uStack_51c;
  undefined1 local_510 [8];
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_4e8;
  undefined8 uStack_4e0;
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_4d8;
  uint uStack_4d0;
  uint uStack_4cc;
  intrusive_list_node *local_4c8;
  undefined8 uStack_4c0;
  task_group_context *local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  unsigned_long local_468 [2];
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  ParallelPrefixSumState<unsigned_long> local_430;
  
  local_580.mapping = (MortonCodeMapping *)local_510;
  piVar1 = (intrusive_list_node *)morton->size_active;
  local_468[0] = 0;
  local_458 = 0x7f8000007f800000;
  uStack_450 = 0x7f8000007f800000;
  local_448 = 0xff800000ff800000;
  uStack_440 = 0xff800000ff800000;
  local_430.counts[1]._4_2_ = 0x401;
  local_430.counts[4] = 0;
  local_430.counts[5] = 0;
  local_430.counts[8] = 8;
  local_510 = (undefined1  [8])mesh;
  tbb::detail::r1::initialize((task_group_context *)&local_430);
  local_560.last = (unsigned_long *)0x0;
  local_560.taskCount = (size_t *)0x400;
  local_538.my_parent = (task_group_context *)&local_598;
  uStack_4e0 = &local_538;
  local_4c8 = (intrusive_list_node *)0x0;
  local_4b8 = (task_group_context *)0x7f8000007f800000;
  uStack_4b0 = 0x7f8000007f800000;
  local_4a8 = 0xff800000ff800000;
  uStack_4a0 = 0xff800000ff800000;
  local_560.first = (unsigned_long *)piVar1;
  pmStack_530 = (mvector<BVHBuilderMorton::BuildPrim> *)&local_580;
  local_4e8.my_parent = (task_group_context *)local_468;
  local_4d8.my_parent = local_538.my_parent;
  tbb::detail::d1::
  start_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/builders/../../common/algorithms/parallel_reduce.h:59:7),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/builders/primrefgen.cpp:177:14)>,_const_tbb::detail::d1::auto_partitioner>
  ::run((blocked_range<unsigned_long> *)&local_560,
        (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_long>,_std::pair<unsigned_long,_embree::BBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_primrefgen_cpp:177:14)>
         *)&local_4e8,(auto_partitioner *)&local_588,(task_group_context *)&local_430);
  piVar4 = local_4c8;
  local_508 = local_4b8;
  uStack_500 = uStack_4b0;
  local_4f8 = local_4a8;
  uStack_4f0 = uStack_4a0;
  cVar5 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_430);
  if (cVar5 != '\0') {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"task cancelled");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy((task_group_context *)&local_430);
  auVar12._8_8_ = extraout_XMM1_Qb;
  auVar12._0_8_ = extraout_XMM1_Qa;
  fVar16 = (float)local_4f8 - (float)local_508;
  fVar17 = local_4f8._4_4_ - local_508._4_4_;
  fVar18 = (float)uStack_4f0 - (float)uStack_500;
  fVar19 = uStack_4f0._4_4_ - uStack_500._4_4_;
  if (piVar4 == piVar1) {
    local_4e8 = local_508;
    uStack_4e0 = (anon_union_8_2_d71db6ad_for_task_group_context_11 *)uStack_500;
    auVar2._4_4_ = fVar17;
    auVar2._0_4_ = fVar16;
    auVar2._8_4_ = fVar18;
    auVar2._12_4_ = fVar19;
    auVar12 = rcpps(auVar12,auVar2);
    fVar11 = auVar12._0_4_;
    fVar13 = auVar12._4_4_;
    fVar14 = auVar12._8_4_;
    fVar15 = auVar12._12_4_;
    uStack_4d0 = (uint)(((1.0 - fVar18 * fVar14) * fVar14 + fVar14) * 1013.76) &
                 -(uint)(1e-19 < fVar18);
    uStack_4cc = (uint)(((1.0 - fVar19 * fVar15) * fVar15 + fVar15) * 1013.76) &
                 -(uint)(1e-19 < fVar19);
    local_4d8._4_4_ =
         (uint)(((1.0 - fVar17 * fVar13) * fVar13 + fVar13) * 1013.76) & -(uint)(1e-19 < fVar17);
    local_4d8._0_4_ =
         (uint)(((1.0 - fVar16 * fVar11) * fVar11 + fVar11) * 1013.76) & -(uint)(1e-19 < fVar16);
    local_430.counts[1]._4_2_ = 0x401;
    local_430.counts[4] = 0;
    local_430.counts[5] = 0;
    local_430.counts[8] = 8;
    local_538.my_parent = (task_group_context *)&local_4e8;
    pmStack_530 = morton;
    local_528 = (TriangleMesh **)local_510;
    tbb::detail::r1::initialize((task_group_context *)&local_430);
    local_560.last = (unsigned_long *)0x0;
    local_560.taskCount = (size_t *)0x400;
    local_580.mapping = (MortonCodeMapping *)&local_538;
    local_560.first = (unsigned_long *)piVar1;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/builders/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_long> *)&local_560,(anon_class_8_1_898bcfc2 *)&local_580,
          (auto_partitioner *)&local_588,(task_group_context *)&local_430);
    cVar5 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_430);
    if (cVar5 != '\0') {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"task cancelled");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&local_430);
  }
  else {
    local_538 = local_508;
    pmStack_530 = (mvector<BVHBuilderMorton::BuildPrim> *)uStack_500;
    auVar3._4_4_ = fVar17;
    auVar3._0_4_ = fVar16;
    auVar3._8_4_ = fVar18;
    auVar3._12_4_ = fVar19;
    auVar12 = rcpps(auVar12,auVar3);
    fVar11 = auVar12._0_4_;
    fVar13 = auVar12._4_4_;
    fVar14 = auVar12._8_4_;
    fVar15 = auVar12._12_4_;
    uStack_520 = (uint)(((1.0 - fVar18 * fVar14) * fVar14 + fVar14) * 1013.76) &
                 -(uint)(1e-19 < fVar18);
    uStack_51c = (uint)(((1.0 - fVar19 * fVar15) * fVar15 + fVar15) * 1013.76) &
                 -(uint)(1e-19 < fVar19);
    local_528 = (TriangleMesh **)
                CONCAT44((uint)(((1.0 - fVar17 * fVar13) * fVar13 + fVar13) * 1013.76) &
                         -(uint)(1e-19 < fVar17),
                         (uint)(((1.0 - fVar16 * fVar11) * fVar11 + fVar11) * 1013.76) &
                         -(uint)(1e-19 < fVar16));
    local_580.mapping = (MortonCodeMapping *)&local_538;
    local_598 = 0;
    local_580.morton = morton;
    local_580.mesh = (TriangleMesh **)local_510;
    local_568 = piVar1;
    iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar8 = (long)local_568 + (0x3ff - local_598) >> 10;
    if ((ulong)(long)iVar6 < uVar8) {
      uVar8 = (long)iVar6;
    }
    uVar9 = 0x40;
    if (uVar8 < 0x40) {
      uVar9 = uVar8;
    }
    local_560.taskCount = &local_590;
    local_560.first = &local_598;
    local_560.state = &local_430;
    local_560.func = &local_580;
    uStack_4e0._0_6_ = CONCAT24(0x401,(undefined4)uStack_4e0);
    local_4c8 = (intrusive_list_node *)0x0;
    uStack_4c0 = 0;
    local_4a8 = 8;
    local_590 = uVar9;
    local_560.last = (unsigned_long *)&local_568;
    tbb::detail::r1::initialize((task_group_context *)&local_4e8);
    local_588.func = &local_560;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar9,1,&local_588,&local_599,(task_group_context *)&local_4e8);
    cVar5 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_4e8);
    if (cVar5 != '\0') {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"task cancelled");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&local_4e8);
    if (local_590 != 0) {
      uVar9 = 0;
      uVar10 = 0;
      do {
        local_430.sums[uVar9] = uVar10;
        uVar10 = uVar10 + local_430.counts[uVar9];
        uVar9 = uVar9 + 1;
      } while (local_590 != uVar9);
    }
    local_580.mapping = (MortonCodeMapping *)&local_538;
    local_598 = 0;
    local_580.morton = morton;
    local_580.mesh = (TriangleMesh **)local_510;
    local_568 = piVar1;
    iVar6 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar8 = (ulong)((long)&piVar1[0x3f].my_next_node + 7U) >> 10;
    if ((ulong)(long)iVar6 < uVar8) {
      uVar8 = (long)iVar6;
    }
    uVar9 = 0x40;
    if (uVar8 < 0x40) {
      uVar9 = uVar8;
    }
    local_560.first = &local_598;
    local_560.last = (unsigned_long *)&local_568;
    local_560.taskCount = &local_590;
    local_560.state = &local_430;
    local_560.func = &local_580;
    uStack_4e0._0_6_ = CONCAT24(0x401,(undefined4)uStack_4e0);
    local_4c8 = (intrusive_list_node *)0x0;
    uStack_4c0 = 0;
    local_4a8 = 8;
    local_590 = uVar9;
    tbb::detail::r1::initialize((task_group_context *)&local_4e8);
    local_588.func = &local_560;
    tbb::detail::d1::
    parallel_for_impl<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_builders_______common_algorithms_parallel_for_h:32:43),_const_tbb::detail::d1::auto_partitioner>
              (0,uVar9,1,&local_588,&local_599,(task_group_context *)&local_4e8);
    cVar5 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_4e8);
    if (cVar5 != '\0') {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"task cancelled");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy((task_group_context *)&local_4e8);
    if (local_590 != 0) {
      uVar9 = 0;
      uVar10 = 0;
      do {
        local_430.sums[uVar9] = uVar10;
        uVar10 = uVar10 + local_430.counts[uVar9];
        uVar9 = uVar9 + 1;
      } while (local_590 != uVar9);
    }
  }
  return (size_t)piVar4;
}

Assistant:

size_t createMortonCodeArray(Mesh* mesh, mvector<BVHBuilderMorton::BuildPrim>& morton, BuildProgressMonitor& progressMonitor)
    {
      size_t numPrimitives = morton.size();

      /* compute scene bounds */
      std::pair<size_t,BBox3fa> cb_empty(0,empty);
      auto cb = parallel_reduce 
        ( size_t(0), numPrimitives, size_t(1024), cb_empty, [&](const range<size_t>& r) -> std::pair<size_t,BBox3fa>
          {
            size_t num = 0;
            BBox3fa bounds = empty;
            
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa prim_bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&prim_bounds))) continue;
              bounds.extend(center2(prim_bounds));
              num++;
            }
            return std::make_pair(num,bounds);
          }, [] (const std::pair<size_t,BBox3fa>& a, const std::pair<size_t,BBox3fa>& b) {
          return std::make_pair(a.first + b.first,merge(a.second,b.second)); 
        });
      
      
      size_t numPrimitivesGen = cb.first;
      const BBox3fa centBounds = cb.second;
      
      /* compute morton codes */
      if (likely(numPrimitivesGen == numPrimitives))
      {
        /* fast path if all primitives were valid */
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_for( size_t(0), numPrimitives, size_t(1024), [&](const range<size_t>& r) -> void {
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
              generator(mesh->bounds(j),unsigned(j));
          });
      }
      else
      {
        /* slow path, fallback in case some primitives were invalid */
        ParallelPrefixSumState<size_t> pstate;
        BVHBuilderMorton::MortonCodeMapping mapping(centBounds);
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[r.begin()]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (unlikely(!mesh->buildBounds(j,&bounds))) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());
        
        parallel_prefix_sum( pstate, size_t(0), numPrimitives, size_t(1024), size_t(0), [&](const range<size_t>& r, const size_t base) -> size_t {
            size_t num = 0;
            BVHBuilderMorton::MortonCodeGenerator generator(mapping,&morton.data()[base]);
            for (size_t j=r.begin(); j<r.end(); j++)
            {
              BBox3fa bounds = empty;
              if (!mesh->buildBounds(j,&bounds)) continue;
              generator(bounds,unsigned(j));
              num++;
            }
            return num;
          }, std::plus<size_t>());          
      }
      return numPrimitivesGen;
    }